

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLe
          (LightLeSample *__return_storage_ptr__,PortalImageInfiniteLight *this,Point2f *u1,
          Point2f *u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar10 [16];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  Vector3f VVar13;
  Point3<float> PVar14;
  SampledSpectrum SVar15;
  Float mapPDF;
  Point2f uv;
  Float duv_dw;
  Bounds2f b;
  Frame wFrame;
  float local_114;
  Tuple2<pbrt::Point2,_float> local_110;
  float local_108;
  uint uStack_104;
  undefined4 uStack_100;
  uint uStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  SampledWavelengths *local_d0;
  Tuple3<pbrt::Vector3,_float> local_c8;
  float local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  Tuple3<pbrt::Vector3,_float> local_78;
  Bounds2<float> local_68;
  Frame local_58;
  undefined8 uVar8;
  undefined1 auVar9 [56];
  undefined1 extraout_var_00 [56];
  
  auVar10._8_4_ = 0x3f800000;
  auVar10._0_8_ = 0x3f8000003f800000;
  auVar10._12_4_ = 0x3f800000;
  local_58.x.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_58.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_c8._0_8_ = vmovlps_avx(auVar10);
  local_d0 = lambda;
  Bounds2<float>::Bounds2(&local_68,(Point2<float> *)&local_58,(Point2<float> *)&local_c8);
  auVar5._0_8_ = WindowedPiecewiseConstant2D::Sample(&this->distribution,u1,&local_68,&local_114);
  auVar5._8_56_ = extraout_var;
  uStack_fc = 0;
  uStack_104 = 0;
  local_110 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
  if ((local_114 != 0.0) || (NAN(local_114))) {
    auVar9 = extraout_var;
    VVar13 = RenderFromImage(this,(Point2f *)&local_110,&local_bc);
    local_108 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar9;
    _local_f8 = auVar4._0_16_;
    local_e8 = ZEXT416((uint)local_bc);
    if ((local_bc != 0.0) || (NAN(local_bc))) {
      uStack_100 = 0;
      local_c8._0_8_ = vmovlps_avx(_local_f8);
      local_88._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
      local_88._8_4_ = auVar9._0_4_ ^ 0x80000000;
      local_88._12_4_ = auVar9._4_4_ ^ 0x80000000;
      local_98 = -local_108;
      uStack_94 = uStack_104 ^ 0x80000000;
      uStack_8c = uStack_fc ^ 0x80000000;
      uStack_90 = 0x80000000;
      auVar2._8_4_ = 0x3f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      auVar2._12_4_ = 0x3f800000;
      local_a8 = vinsertps_avx(auVar2,ZEXT416((uint)local_114),0x10);
      local_c8.z = local_108;
      Frame::FromZ(&local_58,(Vector3f *)&local_c8);
      auVar6._0_8_ = SampleUniformDiskConcentric(u2);
      uVar8 = extraout_var_00._0_8_;
      auVar6._8_56_ = extraout_var_00;
      local_b8 = this->sceneRadius;
      local_78._0_8_ = vmovlps_avx(auVar6._0_16_);
      local_78.z = 0.0;
      fStack_b4 = local_b8;
      fStack_b0 = local_b8;
      fStack_ac = local_b8;
      VVar13 = Frame::FromLocal(&local_58,(Vector3f *)&local_78);
      auVar3._0_4_ = local_b8 * VVar13.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar3._4_4_ = fStack_b4 * VVar13.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar3._8_4_ = fStack_b0 * (float)uVar8;
      auVar3._12_4_ = fStack_ac * (float)((ulong)uVar8 >> 0x20);
      uVar8 = auVar3._8_8_;
      local_c8.z = local_b8 * VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
      local_c8._0_8_ = vmovlps_avx(auVar3);
      PVar14 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_c8);
      fVar1 = this->sceneRadius;
      local_f8._4_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.y + fVar1 * (float)local_f8._4_4_;
      local_f8._0_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.x + fVar1 * (float)local_f8._0_4_;
      fStack_f0 = (float)uVar8 + fVar1 * fStack_f0;
      fStack_ec = (float)((ulong)uVar8 >> 0x20) + fVar1 * fStack_ec;
      local_108 = PVar14.super_Tuple3<pbrt::Point3,_float>.z + fVar1 * local_108;
      auVar12 = ZEXT856(local_a8._8_8_);
      auVar10 = vinsertps_avx(ZEXT416((uint)(fVar1 * fVar1 * 3.1415927)),
                              ZEXT416((uint)local_e8._0_4_),0x10);
      local_e8 = vdivps_avx(local_a8,auVar10);
      auVar9 = ZEXT856(local_e8._8_8_);
      SVar15 = ImageLookup(this,(Point2f *)&local_110,local_d0);
      auVar11._0_8_ = SVar15.values.values._8_8_;
      auVar11._8_56_ = auVar12;
      auVar7._0_8_ = SVar15.values.values._0_8_;
      auVar7._8_56_ = auVar9;
      auVar10 = vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
      *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar10;
      uVar8 = vmovlps_avx(_local_f8);
      (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
      (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar8 >> 0x20);
      (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = local_108;
      uVar8 = vmovlps_avx(local_88);
      (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar8;
      (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar8 >> 0x20);
      (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
      (__return_storage_ptr__->ray).time = time;
      (__return_storage_ptr__->ray).medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = 0;
      (__return_storage_ptr__->intr).set = false;
    }
    else {
      auVar5 = ZEXT1264(ZEXT812(0));
      *(undefined1 (*) [64])((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = auVar5;
      *(undefined1 (*) [64])((long)&(__return_storage_ptr__->intr).optionalValue + 8) = auVar5;
      *(undefined1 (*) [64])__return_storage_ptr__ = auVar5;
      local_e8 = ZEXT416(0) << 0x20;
    }
    uVar8 = vmovlps_avx(local_e8);
    __return_storage_ptr__->pdfPos = (Float)(int)uVar8;
    __return_storage_ptr__->pdfDir = (Float)(int)((ulong)uVar8 >> 0x20);
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
    *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
    __return_storage_ptr__->pdfPos = 0.0;
    __return_storage_ptr__->pdfDir = 0.0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    (__return_storage_ptr__->L).values.values[0] = 0.0;
    (__return_storage_ptr__->L).values.values[1] = 0.0;
    (__return_storage_ptr__->L).values.values[2] = 0.0;
    (__return_storage_ptr__->L).values.values[3] = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
    (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

LightLeSample PortalImageInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                                 SampledWavelengths &lambda,
                                                 Float time) const {
    Float mapPDF;
    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Point2f uv = distribution.Sample(u1, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f w = -RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdfDir = mapPDF / duv_dw;

#if 0
    // Just sample within the portal.
    // This works with the light path integrator, but not BDPT :-(
    Point3f p = portal[0] + u2[0] * (portal[1] - portal[0]) +
        u2[1] * (portal[3] - portal[0]);
    // Compute _PortalImageInfiniteLight_ ray PDFs
    Ray ray(p, w, time);

    // Cosine to account for projected area of portal w.r.t. ray direction.
    Normal3f n = Normal3f(portalFrame.z);
    Float pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLeSample(L, ray, pdfPos, pdfDir);
}